

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditable.h
# Opt level: O1

TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> __thiscall
rtosc::MidiMapperStorage::
TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_>::insert
          (TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> *this,
          function<void_(short,_std::function<void_(const_char_*)>)> *t_)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  function<void_(short,_std::function<void_(const_char_*)>)> *__s;
  TinyVector<std::function<void_(short,_std::function<void_(const_char_*)>)>_> TVar7;
  
  uVar1 = (long)this->n + 1;
  uVar5 = 0xffffffffffffffff;
  if (-2 < (long)this->n) {
    uVar5 = uVar1 * 0x20 + 8;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = uVar1;
  __s = (function<void_(short,_std::function<void_(const_char_*)>)> *)(puVar3 + 1);
  if ((int)uVar1 != 0) {
    memset(__s,0,uVar1 * 0x20);
  }
  iVar2 = this->n;
  if (0 < iVar2) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=
                ((function<void_(short,_std::function<void_(const_char_*)>)> *)
                 ((long)&(__s->super__Function_base)._M_functor + lVar6),
                 (function<void_(short,_std::function<void_(const_char_*)>)> *)
                 ((long)&(this->t->super__Function_base)._M_functor + lVar6));
      lVar4 = lVar4 + 1;
      iVar2 = this->n;
      lVar6 = lVar6 + 0x20;
    } while (lVar4 < iVar2);
  }
  std::function<void_(short,_std::function<void_(const_char_*)>)>::operator=(__s + iVar2,t_);
  TVar7._0_8_ = uVar1 & 0xffffffff;
  TVar7.t = __s;
  return TVar7;
}

Assistant:

TinyVector insert(const T &t_)
            {TinyVector next(n+1); for(int i=0;i<n; ++i) next.t[i]=t[i]; next.t[n] = t_;return next;}